

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

uint __thiscall FreeTypeFaceWrapper::GetFontFlags(FreeTypeFaceWrapper *this)

{
  bool bVar1;
  uint local_14;
  uint flags;
  FreeTypeFaceWrapper *this_local;
  
  bVar1 = IsFixedPitch(this);
  local_14 = (uint)bVar1;
  bVar1 = IsSerif(this);
  if (bVar1) {
    local_14 = local_14 | 2;
  }
  bVar1 = IsSymbolic(this);
  if (bVar1) {
    local_14 = local_14 | 4;
  }
  else {
    local_14 = local_14 | 0x20;
  }
  bVar1 = IsScript(this);
  if (bVar1) {
    local_14 = local_14 | 8;
  }
  bVar1 = IsItalic(this);
  if (bVar1) {
    local_14 = local_14 | 0x40;
  }
  bVar1 = IsForceBold(this);
  if (bVar1) {
    local_14 = local_14 | 0x40000;
  }
  return local_14;
}

Assistant:

unsigned int FreeTypeFaceWrapper::GetFontFlags()
{
	unsigned int flags = 0;

	/* 
		flags are a combination of:
		
		1 - Fixed Pitch
		2 - Serif
		3 - Symbolic
		4 - Script
		6 - Nonsymbolic
		7 - Italic
		17 - AllCap
		18 - SmallCap
		19 - ForceBold

		not doing allcap,smallcap
	*/

	if(IsFixedPitch())
		flags |= 1;
	if(IsSerif())
		flags |= 2;
	if(IsSymbolic())
		flags |= 4;
	else
		flags |= 32;
	if(IsScript())
		flags |= 8;
	if(IsItalic())
		flags |= 64;
	if(IsForceBold())
		flags |= (1<<18);

	return flags;
}